

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_line_reader.c
# Opt level: O0

int LoadFullBuffer(StackLineReader *reader)

{
  int iVar1;
  void *in_RDI;
  int unaff_retaddr;
  int read;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = CpuFeatures_ReadFile
                    (unaff_retaddr,in_RDI,
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(void **)((long)in_RDI + 0x400) = in_RDI;
  *(long *)((long)in_RDI + 0x408) = (long)iVar1;
  return iVar1;
}

Assistant:

static int LoadFullBuffer(StackLineReader* reader) {
  const int read = CpuFeatures_ReadFile(reader->fd, reader->buffer,
                                        STACK_LINE_READER_BUFFER_SIZE);
  assert(read >= 0);
  reader->view.ptr = reader->buffer;
  reader->view.size = read;
  return read;
}